

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

String * __thiscall
glcts::UniformBlocksLayoutBindingCase::buildBlock
          (String *__return_storage_ptr__,UniformBlocksLayoutBindingCase *this,String *name,
          String *type)

{
  ostream *poVar1;
  ostringstream s;
  undefined1 auStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_198,"{",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)auStack_198,(type->_M_dataplus)._M_p,type->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_a; ",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)auStack_198,(type->_M_dataplus)._M_p,type->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_b; ",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_198,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_198);
  std::ios_base::~ios_base((ios_base *)(auStack_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

String buildBlock(const String& name, const String& type)
	{

		std::ostringstream s;
		s << "{";
		s << type << " " << name << "_a; ";
		s << type << " " << name << "_b; ";
		s << "}";
		return s.str();
	}